

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O3

int ERKStepGetEstLocalErrors(void *arkode_mem,N_Vector ele)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  ARKodeMem local_20;
  ARKodeERKStepMem local_18;
  
  iVar1 = erkStep_AccessStepMem(arkode_mem,"ERKStepGetEstLocalErrors",&local_20,&local_18);
  if (iVar1 == 0) {
    N_VScale(1.0,local_20->tempv1,ele);
  }
  return iVar1;
}

Assistant:

int ERKStepGetEstLocalErrors(void *arkode_mem, N_Vector ele)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepGetEstLocalErrors",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* copy vector to output */
  N_VScale(ONE, ark_mem->tempv1, ele);

  return(ARK_SUCCESS);
}